

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

void __thiscall mkvparser::Cues::~Cues(Cues *this)

{
  long lVar1;
  long lVar2;
  CuePoint *this_00;
  CuePoint **ppCVar3;
  long lVar4;
  
  ppCVar3 = this->m_cue_points;
  lVar1 = this->m_count;
  lVar2 = this->m_preload_count;
  if (ppCVar3 != ppCVar3 + lVar1 + lVar2) {
    lVar4 = 0;
    do {
      this_00 = *(CuePoint **)((long)ppCVar3 + lVar4);
      if (this_00 != (CuePoint *)0x0) {
        CuePoint::~CuePoint(this_00);
      }
      operator_delete(this_00);
      lVar4 = lVar4 + 8;
    } while (lVar2 * 8 + lVar1 * 8 != lVar4);
    ppCVar3 = this->m_cue_points;
  }
  if (ppCVar3 != (CuePoint **)0x0) {
    operator_delete__(ppCVar3);
    return;
  }
  return;
}

Assistant:

Cues::~Cues() {
  const long n = m_count + m_preload_count;

  CuePoint** p = m_cue_points;
  CuePoint** const q = p + n;

  while (p != q) {
    CuePoint* const pCP = *p++;
    assert(pCP);

    delete pCP;
  }

  delete[] m_cue_points;
}